

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall
crnlib::mipmapped_texture::mipmapped_texture(mipmapped_texture *this,mipmapped_texture *other)

{
  mipmapped_texture *other_local;
  mipmapped_texture *this_local;
  
  dynamic_string::dynamic_string(&this->m_name);
  this->m_width = 0;
  this->m_height = 0;
  this->m_comp_flags = cDefaultCompFlags;
  this->m_format = PIXEL_FMT_INVALID;
  vector<crnlib::vector<crnlib::mip_level_*>_>::vector(&this->m_faces);
  dynamic_string::dynamic_string(&this->m_last_error);
  operator=(this,other);
  return;
}

Assistant:

mipmapped_texture::mipmapped_texture(const mipmapped_texture& other)
    : m_width(0),
      m_height(0),
      m_comp_flags(pixel_format_helpers::cDefaultCompFlags),
      m_format(PIXEL_FMT_INVALID) {
  *this = other;
}